

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.h
# Opt level: O2

void __thiscall LTFlightData::FDKeyTy::FDKeyTy(FDKeyTy *this,FDKeyType _eType,string *_key,int base)

{
  string sStack_58;
  string local_38;
  
  this->eKeyType = KEY_UNKNOWN;
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  (this->key)._M_string_length = 0;
  (this->key).field_2._M_local_buf[0] = '\0';
  this->num = 0;
  std::__cxx11::string::string((string *)&sStack_58,(string *)_key);
  SetKey(&local_38,this,_eType,&sStack_58,base);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  return;
}

Assistant:

FDKeyTy(FDKeyType _eType, const std::string _key, int base=16)  { SetKey(_eType, _key, base); }